

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.cpp
# Opt level: O0

uint16 crnlib::dxt1_block::pack_color(color_quad_u8 *color,bool scaled,uint bias)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint local_24;
  uint local_20;
  uint b;
  uint g;
  uint r;
  uint bias_local;
  bool scaled_local;
  color_quad_u8 *color_local;
  
  b = (uint)(color->field_0).field_0.r;
  local_20 = (uint)(color->field_0).field_0.g;
  local_24 = (uint)(color->field_0).field_0.b;
  if (scaled) {
    b = (b * 0x1f + bias) / 0xff;
    local_20 = (local_20 * 0x3f + bias) / 0xff;
    local_24 = (local_24 * 0x1f + bias) / 0xff;
  }
  uVar1 = math::minimum<unsigned_int>(b,0x1f);
  uVar2 = math::minimum<unsigned_int>(local_20,0x3f);
  uVar3 = math::minimum<unsigned_int>(local_24,0x1f);
  return (ushort)uVar3 | (ushort)(uVar2 << 5) | (ushort)(uVar1 << 0xb);
}

Assistant:

uint16 dxt1_block::pack_color(const color_quad_u8& color, bool scaled, uint bias) {
  uint r = color.r;
  uint g = color.g;
  uint b = color.b;

  if (scaled) {
    r = (r * 31U + bias) / 255U;
    g = (g * 63U + bias) / 255U;
    b = (b * 31U + bias) / 255U;
  }

  r = math::minimum(r, 31U);
  g = math::minimum(g, 63U);
  b = math::minimum(b, 31U);

  return static_cast<uint16>(b | (g << 5U) | (r << 11U));
}